

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmund~.c
# Opt level: O3

t_int * sigmund_perform(t_int *w)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  
  lVar3 = w[1];
  iVar6 = (int)w[3];
  if (*(int *)(lVar3 + 0x70) % iVar6 == 0) {
    if (*(int *)(lVar3 + 0x6c) < 1) {
      iVar1 = *(int *)(lVar3 + 0x68);
      iVar2 = *(int *)(lVar3 + 0x54);
      if (iVar1 != iVar2) {
        if (0 < iVar6) {
          lVar4 = w[2];
          lVar5 = *(long *)(lVar3 + 0x60);
          lVar7 = 0;
          do {
            *(undefined4 *)((long)iVar1 * 4 + lVar5 + lVar7 * 4) =
                 *(undefined4 *)(lVar4 + lVar7 * 4);
            lVar7 = lVar7 + 1;
          } while (iVar6 != (int)lVar7);
        }
        *(int *)(lVar3 + 0x68) = iVar1 + iVar6;
        if (iVar1 + iVar6 == iVar2) {
          clock_delay(*(_clock **)(lVar3 + 0x30),0.0);
        }
      }
    }
    else {
      *(int *)(lVar3 + 0x6c) = *(int *)(lVar3 + 0x6c) - iVar6;
    }
  }
  return w + 4;
}

Assistant:

static t_int *sigmund_perform(t_int *w)
{
    t_sigmund *x = (t_sigmund *)(w[1]);
    t_sample *in = (t_sample *)(w[2]);
    int n = (int)(w[3]);

    if (x->x_hop % n)
        return (w+4);
    if (x->x_countdown > 0)
        x->x_countdown -= n;
    else if (x->x_infill != x->x_npts)
    {
        int j;
        t_float *fp = x->x_inbuf + x->x_infill;
        for (j = 0; j < n; j++)
            *fp++ = *in++;
        x->x_infill += n;
        if (x->x_infill == x->x_npts)
            clock_delay(x->x_clock, 0);
    }
    return (w+4);
}